

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgDisplay * __thiscall
cimg_library::CImgDisplay::resize(CImgDisplay *this,int nwidth,int nheight,bool force_redraw)

{
  Display *pDVar1;
  int iVar2;
  int iVar3;
  CImgDisplay *pCVar4;
  uint uVar5;
  uint ndimx;
  bool bVar6;
  bool bVar7;
  
  if (nheight != 0 && nwidth != 0) {
    bVar6 = this->_width == 0;
    bVar7 = this->_height == 0;
    if (-1 < (nheight | nwidth) || !bVar7 && !bVar6) {
      if (bVar7 || bVar6) {
        this = assign(this,nwidth,nheight,(char *)0x0,3,false,false);
      }
      else {
        if (cimg::X11_attr()::val == '\0') {
          resize();
        }
        pDVar1 = cimg::X11_attr::val.display;
        if (nwidth < 1) {
          nwidth = -(nwidth * this->_width) / 100;
        }
        if (nheight < 1) {
          nheight = -(nheight * this->_height) / 100;
        }
        ndimx = nwidth + (uint)(nwidth == 0);
        uVar5 = nheight + (uint)(nheight == 0);
        XLockDisplay(cimg::X11_attr::val.display);
        if ((this->_window_width != ndimx) || (this->_window_height != uVar5)) {
          XResizeWindow(pDVar1,this->_window,ndimx,uVar5);
        }
        if ((this->_width != ndimx) || (this->_height != uVar5)) {
          if (cimg::X11_attr()::val == '\0') {
            resize();
          }
          if (cimg::X11_attr::val.nb_bits == 0x10) {
            _resize<unsigned_short>(this,0,ndimx,uVar5,force_redraw);
          }
          else if (cimg::X11_attr::val.nb_bits == 8) {
            _resize<unsigned_char>(this,'\0',ndimx,uVar5,force_redraw);
          }
          else {
            _resize<unsigned_int>(this,0,ndimx,uVar5,force_redraw);
          }
        }
        this->_width = ndimx;
        this->_window_width = ndimx;
        this->_height = uVar5;
        this->_window_height = uVar5;
        this->_is_resized = false;
        XUnlockDisplay(pDVar1);
        if (this->_is_fullscreen == true) {
          iVar2 = screen_width();
          uVar5 = this->_width;
          iVar3 = screen_height();
          move(this,iVar2 - uVar5 >> 1,iVar3 - this->_height >> 1);
        }
        if (force_redraw) {
          pCVar4 = paint(this,true);
          return pCVar4;
        }
      }
      return this;
    }
  }
  pCVar4 = assign(this);
  return pCVar4;
}

Assistant:

CImgDisplay& resize(const int nwidth, const int nheight, const bool force_redraw=true) {
      if (!nwidth || !nheight || (is_empty() && (nwidth<0 || nheight<0))) return assign();
      if (is_empty()) return assign(nwidth,nheight);
      Display *const dpy = cimg::X11_attr().display;
      const unsigned int
        tmpdimx = (nwidth>0)?nwidth:(-nwidth*_width/100),
        tmpdimy = (nheight>0)?nheight:(-nheight*_height/100),
        dimx = tmpdimx?tmpdimx:1,
        dimy = tmpdimy?tmpdimy:1;
      XLockDisplay(dpy);
      if (_window_width!=dimx || _window_height!=dimy) XResizeWindow(dpy,_window,dimx,dimy);
      if (_width!=dimx || _height!=dimy) switch (cimg::X11_attr().nb_bits) {
        case 8 :  { unsigned char pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
        case 16 : { unsigned short pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
        default : { unsigned int pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); }
        }
      _window_width = _width = dimx; _window_height = _height = dimy;
      _is_resized = false;
      XUnlockDisplay(dpy);
      if (_is_fullscreen) move((screen_width()-_width)/2,(screen_height()-_height)/2);
      if (force_redraw) return paint();
      return *this;
    }